

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void Node_RemoveData(node *Node,dataid Id,datatype Type)

{
  long lVar1;
  nodecontext *p;
  nodedata **i;
  uint_fast32_t Code;
  datatype Type_local;
  dataid Id_local;
  node *Node_local;
  
  if (Node == (node *)0x0) {
    __assert_fail("(const void*)(Node)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x1f8,"void Node_RemoveData(node *, dataid, datatype)");
  }
  p = (nodecontext *)&Node->Data;
  while( true ) {
    lVar1._0_4_ = (p->Base).Base.FourCC;
    lVar1._4_4_ = (p->Base).Base.Magic;
    if (lVar1 == 0) {
      return;
    }
    if (*(ulong *)(*(long *)&(p->Base).Base + 8) == (Id << 8 | Type)) break;
    p = *(nodecontext **)&(p->Base).Base;
  }
  DataFree(*Node->VMT,Node,(nodedata **)p,0);
  return;
}

Assistant:

NOINLINE void Node_RemoveData(node* Node, dataid Id, datatype Type)
{
    uint_fast32_t Code = (Id<<DYNDATA_SHIFT)|Type;
    nodedata** i;
    nodecontext* p = Node_Context(Node);

    for (i=&Node->Data;*i;i=&(*i)->Next)
        if ((*i)->Code == Code)
        {
            DataFree(p,Node,i,0);
            break;
        }
}